

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O1

bool __thiscall SubCircuit<0>::propagateSCC(SubCircuit<0> *this,int root)

{
  vec<int> *pvVar1;
  int *piVar2;
  Clause *pCVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  Lit LVar7;
  uint uVar8;
  long lVar9;
  Tchar *pTVar10;
  uint uVar11;
  ulong uVar12;
  IntVar *pIVar13;
  vec<int> *pvVar14;
  vec<int> *other;
  int iVar15;
  ulong uVar16;
  undefined1 reason [8];
  vec<int> thisSubtree;
  vec<int> prev_later;
  vec<int> alloutside;
  vec<int> prev_this_later;
  int backto;
  int backfrom;
  int numback;
  vec<int> this_later;
  vec<int> local_298;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  bool local_278;
  vec<int> local_268;
  vec<int> local_258;
  Clause *local_248;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  ulong local_228;
  int local_220;
  int local_21c;
  vec<int> local_218;
  ulong local_208;
  Clause *local_200;
  int **local_1f8;
  vec<int> *local_1f0;
  vec<SubCircuit<0>::PROP> *local_1e8;
  vec<int> local_180;
  vec<int> local_170;
  vec<int> local_160;
  vec<int> local_150;
  vec<int> local_140;
  vec<int> local_130;
  vec<int> local_120;
  vec<int> local_110;
  vec<int> local_100;
  vec<int> local_f0;
  vec<int> local_e0;
  vec<int> local_d0;
  vec<int> local_c0;
  vec<int> local_b0;
  IntVar *local_a0;
  long local_98;
  vec<int> local_90;
  vec<int> local_80;
  vec<int> local_70;
  vec<int> local_60;
  ulong local_50;
  vec<int> *local_48;
  vec<int> local_40;
  
  local_22c = 0;
  local_230 = 0;
  local_21c = 0;
  local_298.sz = 0;
  local_298.cap = 0;
  local_298.data = (int *)0x0;
  local_234 = root;
  vec<int>::reserve(&local_298,*(uint *)&(this->super_Propagator).field_0x14);
  other = &this->prev;
  if ((this->prev).data != (int *)0x0) {
    other->sz = 0;
  }
  local_1f0 = &this->earlier;
  if ((this->earlier).data != (int *)0x0) {
    local_1f0->sz = 0;
  }
  pvVar1 = &this->later;
  if ((this->later).data != (int *)0x0) {
    pvVar1->sz = 0;
  }
  if (0 < *(int *)&(this->super_Propagator).field_0x14) {
    piVar2 = this->index;
    lVar9 = 0;
    do {
      piVar2[lVar9] = -1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)&(this->super_Propagator).field_0x14);
  }
  this->index[local_234] = 0;
  this->lowlink[local_234] = 0;
  this->nodesSeen = 1;
  local_1e8 = &this->propQueue;
  if ((this->propQueue).data != (PROP *)0x0) {
    local_1e8->sz = 0;
  }
  pIVar13 = this->x[local_234].var;
  iVar6 = (pIVar13->min).v;
  local_228 = 0;
  local_1f8 = &local_170.data;
  local_220 = 0;
  local_a0 = pIVar13;
  do {
    iVar4 = local_220;
    lVar9 = (long)iVar6;
    bVar5 = true;
    iVar15 = iVar6;
    if (this->index[lVar9] == -1) {
      local_21c = 0;
      local_98 = lVar9;
      bVar5 = exploreSubtree(this,iVar6,(int)local_228,local_220,&local_22c,&local_230,&local_21c);
      if (bVar5) {
        if (local_298.data != (int *)0x0) {
          local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
        }
        if ((this->later).data != (int *)0x0) {
          pvVar1->sz = 0;
        }
        local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
        local_238 = iVar6;
        if (0 < *(int *)&(this->super_Propagator).field_0x14) {
          iVar6 = 0;
          do {
            pvVar14 = pvVar1;
            if ((this->index[iVar6] < 0) || (pvVar14 = &local_298, iVar4 < this->index[iVar6])) {
              vec<int>::push(pvVar14,(int *)local_288);
            }
            iVar6 = local_288._0_4_ + 1;
            local_288._0_4_ = iVar6;
          } while (iVar6 < *(int *)&(this->super_Propagator).field_0x14);
        }
        uVar16 = local_298._0_8_ & 0xffffffff;
        local_b0.sz = local_298.sz;
        local_b0.cap = local_298.sz;
        local_b0.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar12 = 0;
          do {
            local_b0.data[uVar12] = local_298.data[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
        LVar7 = getEvidenceLit(this,&local_b0);
        iVar15 = local_238;
        local_248 = (Clause *)CONCAT44(local_248._4_4_,LVar7.x);
        if (local_b0.data != (int *)0x0) {
          free(local_b0.data);
        }
        local_b0.data = (int *)0x0;
        vec<int>::vec<int>(&local_60,other);
        LVar7 = getEvidenceLit(this,&local_60);
        if (local_60.data != (int *)0x0) {
          free(local_60.data);
        }
        local_60.data = (int *)0x0;
        local_268.sz = 0;
        local_268.cap = 0;
        local_268.data = (int *)0x0;
        if (other->sz == 0) {
          if (pvVar1->sz != 0) {
            lVar9 = 0;
            uVar16 = 0;
            do {
              vec<int>::push(&local_268,(int *)((long)(this->later).data + lVar9));
              uVar16 = uVar16 + 1;
              lVar9 = lVar9 + 4;
            } while (uVar16 < (this->later).sz);
          }
          vec<int>::push(&local_268,&local_234);
          uVar16 = local_268._0_8_ & 0xffffffff;
          local_c0.sz = local_268.sz;
          local_c0.cap = local_268.sz;
          local_c0.data = (int *)malloc(uVar16 * 4);
          if (uVar16 != 0) {
            uVar12 = 0;
            do {
              local_c0.data[uVar12] = local_268.data[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
          }
          LVar7 = getEvidenceLit(this,&local_c0);
          iVar15 = local_238;
          if (local_c0.data != (int *)0x0) {
            free(local_c0.data);
          }
          local_c0.data = (int *)0x0;
        }
        if (LVar7.x == 1 || (uint)local_248 == 1) {
LAB_00142a6b:
          pvVar14 = local_1f0;
          if (other->sz != 0) {
            lVar9 = 0;
            uVar16 = 0;
            do {
              vec<int>::push(pvVar14,(int *)((long)(this->prev).data + lVar9));
              uVar16 = uVar16 + 1;
              lVar9 = lVar9 + 4;
            } while (uVar16 < (this->prev).sz);
          }
          if ((this->prev).data != (int *)0x0) {
            other->sz = 0;
          }
          if (local_298.sz != 0) {
            lVar9 = 0;
            uVar16 = 0;
            do {
              vec<int>::push(other,(int *)((long)local_298.data + lVar9));
              uVar16 = uVar16 + 1;
              lVar9 = lVar9 + 4;
            } while (uVar16 < (local_298._0_8_ & 0xffffffff));
          }
          local_228 = (ulong)(local_220 + 1);
          local_220 = this->nodesSeen + -1;
          bVar5 = true;
          iVar15 = local_238;
        }
        else {
          if (local_21c != 0) {
            if ((local_21c == 1) && (this->fixReq != false)) {
              if (so.lazy == true) {
                if (other->sz == 0) {
                  iVar6 = local_268.sz * local_298.sz + 2;
                  local_23c = LVar7.x;
                  local_288 = (undefined1  [8])malloc((long)iVar6 * 4 + 8);
                  *(uint *)local_288 = (*(uint *)local_288 & 0xfc) + iVar6 * 0x100 + 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_288);
                  reason = local_288;
                  if (*(uint *)local_288 < 0x200) goto LAB_00143242;
                  *(uint *)((long)local_288 + 8) = (uint)local_248;
                  if (*(uint *)local_288 < 0x300) goto LAB_00143242;
                  ((Clause *)((long)local_288 + 8))->data[0].x = local_23c;
                  uVar16 = local_298._0_8_ & 0xffffffff;
                  local_130.sz = local_298.sz;
                  local_130.cap = local_298.sz;
                  local_130.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_130.data[uVar12] = local_298.data[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  uVar16 = local_268._0_8_ & 0xffffffff;
                  local_140.sz = local_268.sz;
                  local_140.cap = local_268.sz;
                  local_140.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_140.data[uVar12] = local_268.data[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  explainAcantreachB(this,(Clause *)reason,3,&local_130,&local_140,local_22c,
                                     local_230);
                  if (local_140.data != (int *)0x0) {
                    free(local_140.data);
                  }
                  local_140.data = (int *)0x0;
                  if (local_130.data != (int *)0x0) {
                    free(local_130.data);
                  }
                  local_130.data = (int *)0x0;
                }
                else {
                  local_288 = (undefined1  [8])0x0;
                  uStack_280 = (int *)0x0;
                  local_23c = LVar7.x;
                  if (other->sz != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push((vec<int> *)local_288,(int *)((long)(this->prev).data + lVar9))
                      ;
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < (this->prev).sz);
                  }
                  if (pvVar1->sz != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push((vec<int> *)local_288,(int *)((long)(this->later).data + lVar9)
                                    );
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < (this->later).sz);
                  }
                  local_258.sz = 0;
                  local_258.cap = 0;
                  local_258.data = (int *)0x0;
                  if (local_288._0_4_ != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push(&local_258,(int *)((long)uStack_280 + lVar9));
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < ((ulong)local_288 & 0xffffffff));
                  }
                  if (local_298.sz != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push(&local_258,(int *)((long)local_298.data + lVar9));
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < (local_298._0_8_ & 0xffffffff));
                  }
                  local_218.sz = 0;
                  local_218.cap = 0;
                  local_218.data = (int *)0x0;
                  if (local_298.sz != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push(&local_218,(int *)((long)local_298.data + lVar9));
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < (local_298._0_8_ & 0xffffffff));
                  }
                  if (pvVar1->sz != 0) {
                    lVar9 = 0;
                    uVar16 = 0;
                    do {
                      vec<int>::push(&local_218,(int *)((long)(this->later).data + lVar9));
                      uVar16 = uVar16 + 1;
                      lVar9 = lVar9 + 4;
                    } while (uVar16 < (this->later).sz);
                  }
                  pvVar14 = local_1f0;
                  uVar11 = local_258.sz * local_1f0->sz;
                  local_228 = (ulong)uVar11;
                  uVar8 = local_218.sz * other->sz;
                  local_208 = (ulong)uVar8;
                  iVar6 = local_288._0_4_ * local_298.sz + uVar8 + uVar11 + 2;
                  local_200 = (Clause *)malloc((long)iVar6 * 4 + 8);
                  *(uint *)local_200 = (*(uint *)local_200 & 0xfc) + iVar6 * 0x100 + 2;
                  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
                  reason = (undefined1  [8])local_200;
                  if (*(uint *)local_200 < 0x200) goto LAB_00143242;
                  *(uint *)(local_200 + 1) = (uint)local_248;
                  if (*(uint *)local_200 < 0x300) goto LAB_00143242;
                  local_200[1].data[0].x = local_23c;
                  vec<int>::vec<int>(&local_40,pvVar14);
                  uVar16 = local_258._0_8_ & 0xffffffff;
                  local_150.sz = local_258.sz;
                  local_150.cap = local_258.sz;
                  local_150.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_150.data[uVar12] = local_258.data[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  explainAcantreachB(this,(Clause *)reason,3,&local_40,&local_150,-1,-1);
                  if (local_150.data != (int *)0x0) {
                    free(local_150.data);
                  }
                  local_150.data = (int *)0x0;
                  if (local_40.data != (int *)0x0) {
                    free(local_40.data);
                  }
                  local_40.data = (int *)0x0;
                  vec<int>::vec<int>(&local_70,other);
                  uVar16 = local_218._0_8_ & 0xffffffff;
                  local_160.sz = local_218.sz;
                  local_160.cap = local_218.sz;
                  local_160.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_160.data[uVar12] = local_218.data[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  iVar6 = (int)local_228 + 3;
                  explainAcantreachB(this,(Clause *)reason,iVar6,&local_70,&local_160,-1,-1);
                  if (local_160.data != (int *)0x0) {
                    free(local_160.data);
                  }
                  local_160.data = (int *)0x0;
                  if (local_70.data != (int *)0x0) {
                    free(local_70.data);
                  }
                  local_70.data = (int *)0x0;
                  uVar16 = local_298._0_8_ & 0xffffffff;
                  local_170.sz = local_298.sz;
                  local_170.cap = local_298.sz;
                  local_170.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_170.data[uVar12] = local_298.data[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  uVar16 = (ulong)local_288 & 0xffffffff;
                  local_180.sz = local_288._0_4_;
                  local_180.cap = local_288._0_4_;
                  local_180.data = (int *)malloc(uVar16 * 4);
                  if (uVar16 != 0) {
                    uVar12 = 0;
                    do {
                      local_180.data[uVar12] = uStack_280[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar16 != uVar12);
                  }
                  explainAcantreachB(this,(Clause *)reason,(int)local_208 + iVar6,&local_170,
                                     &local_180,local_22c,local_230);
                  if (local_180.data != (int *)0x0) {
                    free(local_180.data);
                  }
                  local_180.data = (int *)0x0;
                  if (local_170.data != (int *)0x0) {
                    free(local_170.data);
                  }
                  local_170.data = (int *)0x0;
                  if (local_218.data != (int *)0x0) {
                    free(local_218.data);
                  }
                  if (local_258.data != (int *)0x0) {
                    free(local_258.data);
                  }
                  if (uStack_280 != (int *)0x0) {
                    free(uStack_280);
                  }
                }
              }
              else {
                reason = (undefined1  [8])0x0;
              }
              uStack_280 = (int *)CONCAT44(local_230,local_22c);
              local_278 = true;
              local_288 = reason;
              vec<SubCircuit<0>::PROP>::push(local_1e8,(PROP *)local_288);
            }
            goto LAB_00142a6b;
          }
          if (so.lazy == true) {
            if (other->sz == 0) {
              iVar6 = local_268.sz * local_298.sz + 2;
              local_23c = LVar7.x;
              local_288 = (undefined1  [8])malloc((long)iVar6 * 4 + 8);
              *(uint *)local_288 = (*(uint *)local_288 & 0xfc) + iVar6 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_288);
              if (*(uint *)local_288 < 0x200) goto LAB_00143242;
              *(uint *)((long)local_288 + 8) = (uint)local_248;
              if (*(uint *)local_288 < 0x300) goto LAB_00143242;
              local_248 = (Clause *)local_288;
              ((Clause *)((long)local_288 + 8))->data[0].x = local_23c;
              uVar16 = local_298._0_8_ & 0xffffffff;
              local_d0.sz = local_298.sz;
              local_d0.cap = local_298.sz;
              local_d0.data = (int *)malloc(uVar16 * 4);
              iVar15 = local_238;
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_d0.data[uVar12] = local_298.data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              uVar16 = local_268._0_8_ & 0xffffffff;
              local_e0.sz = local_268.sz;
              local_e0.cap = local_268.sz;
              local_e0.data = (int *)malloc(uVar16 * 4);
              pCVar3 = local_248;
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_e0.data[uVar12] = local_268.data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              explainAcantreachB(this,local_248,3,&local_d0,&local_e0,*local_298.data,
                                 *local_268.data);
              if (local_e0.data != (int *)0x0) {
                free(local_e0.data);
              }
              local_e0.data = (int *)0x0;
              if (local_d0.data != (int *)0x0) {
                free(local_d0.data);
              }
              local_d0.data = (int *)0x0;
              pIVar13 = this->x[*local_298.data].var;
              (*(pIVar13->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar13,(long)*local_268.data,pCVar3,1);
            }
            else {
              local_288 = (undefined1  [8])0x0;
              uStack_280 = (int *)0x0;
              local_23c = LVar7.x;
              if (other->sz != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push((vec<int> *)local_288,(int *)((long)(this->prev).data + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < (this->prev).sz);
              }
              if (pvVar1->sz != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push((vec<int> *)local_288,(int *)((long)(this->later).data + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < (this->later).sz);
              }
              local_258.sz = 0;
              local_258.cap = 0;
              local_258.data = (int *)0x0;
              if (local_288._0_4_ != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push(&local_258,(int *)((long)uStack_280 + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < ((ulong)local_288 & 0xffffffff));
              }
              local_48 = other;
              if (local_298.sz != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push(&local_258,(int *)((long)local_298.data + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < (local_298._0_8_ & 0xffffffff));
              }
              local_218.sz = 0;
              local_218.cap = 0;
              local_218.data = (int *)0x0;
              if (local_298.sz != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push(&local_218,(int *)((long)local_298.data + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < (local_298._0_8_ & 0xffffffff));
              }
              if (pvVar1->sz != 0) {
                lVar9 = 0;
                uVar16 = 0;
                do {
                  vec<int>::push(&local_218,(int *)((long)(this->later).data + lVar9));
                  uVar16 = uVar16 + 1;
                  lVar9 = lVar9 + 4;
                } while (uVar16 < (this->later).sz);
              }
              other = local_48;
              pvVar14 = local_1f0;
              uVar11 = local_258.sz * local_1f0->sz;
              local_208 = (ulong)uVar11;
              uVar8 = local_218.sz * local_48->sz;
              local_50 = (ulong)uVar8;
              iVar6 = local_288._0_4_ * local_298.sz + uVar8 + uVar11 + 2;
              local_200 = (Clause *)malloc((long)iVar6 * 4 + 8);
              *(uint *)local_200 = (*(uint *)local_200 & 0xfc) + iVar6 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_200);
              iVar15 = local_238;
              if (*(uint *)local_200 < 0x200) {
LAB_00143242:
                abort();
              }
              *(uint *)(local_200 + 1) = (uint)local_248;
              if (*(uint *)local_200 < 0x300) goto LAB_00143242;
              local_248 = local_200;
              local_200[1].data[0].x = local_23c;
              vec<int>::vec<int>(&local_80,pvVar14);
              uVar16 = local_258._0_8_ & 0xffffffff;
              local_f0.sz = local_258.sz;
              local_f0.cap = local_258.sz;
              local_f0.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_f0.data[uVar12] = local_258.data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              explainAcantreachB(this,local_248,3,&local_80,&local_f0,-1,-1);
              if (local_f0.data != (int *)0x0) {
                free(local_f0.data);
              }
              local_f0.data = (int *)0x0;
              if (local_80.data != (int *)0x0) {
                free(local_80.data);
              }
              local_80.data = (int *)0x0;
              vec<int>::vec<int>(&local_90,other);
              uVar16 = local_218._0_8_ & 0xffffffff;
              local_100.sz = local_218.sz;
              local_100.cap = local_218.sz;
              local_100.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_100.data[uVar12] = local_218.data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              uVar8 = (int)local_208 + 3;
              explainAcantreachB(this,local_248,uVar8,&local_90,&local_100,-1,-1);
              if (local_100.data != (int *)0x0) {
                free(local_100.data);
              }
              local_100.data = (int *)0x0;
              local_208 = (ulong)uVar8;
              if (local_90.data != (int *)0x0) {
                free(local_90.data);
              }
              local_90.data = (int *)0x0;
              uVar16 = local_298._0_8_ & 0xffffffff;
              local_110.sz = local_298.sz;
              local_110.cap = local_298.sz;
              local_110.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_110.data[uVar12] = local_298.data[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              uVar16 = (ulong)local_288 & 0xffffffff;
              local_120.sz = local_288._0_4_;
              local_120.cap = local_288._0_4_;
              local_120.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar12 = 0;
                do {
                  local_120.data[uVar12] = uStack_280[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              explainAcantreachB(this,local_248,(int)local_50 + (int)local_208,&local_110,&local_120
                                 ,*local_298.data,*uStack_280);
              if (local_120.data != (int *)0x0) {
                free(local_120.data);
              }
              local_120.data = (int *)0x0;
              if (local_110.data != (int *)0x0) {
                free(local_110.data);
              }
              local_110.data = (int *)0x0;
              pIVar13 = this->x[*local_298.data].var;
              (*(pIVar13->super_Var).super_Branching._vptr_Branching[0x10])
                        (pIVar13,(long)*uStack_280,local_248,1);
              if (local_218.data != (int *)0x0) {
                free(local_218.data);
              }
              if (local_258.data != (int *)0x0) {
                free(local_258.data);
              }
              if (uStack_280 != (int *)0x0) {
                free(uStack_280);
              }
            }
            bVar5 = false;
          }
          else {
            bVar5 = false;
          }
        }
        lVar9 = local_98;
        pIVar13 = local_a0;
        if (local_268.data != (int *)0x0) {
          free(local_268.data);
          lVar9 = local_98;
          pIVar13 = local_a0;
        }
      }
      else {
        bVar5 = false;
        lVar9 = local_98;
        pIVar13 = local_a0;
      }
    }
    if (!bVar5) {
      if (local_298.data != (int *)0x0) {
        free(local_298.data);
      }
      return false;
    }
    iVar6 = -0x80000000;
    if (iVar15 != (pIVar13->max).v) {
      pTVar10 = pIVar13->vals + lVar9;
      iVar6 = iVar15;
      do {
        pTVar10 = pTVar10 + 1;
        iVar6 = iVar6 + 1;
      } while (pTVar10->v == '\0');
    }
  } while( true );
}

Assistant:

bool propagateSCC(int root) {
		int backfrom = 0;  // the last back edge found
		int backto = 0;
		int numback = 0;  // the number of back edges found

		vec<int> thisSubtree;

		thisSubtree.reserve(size);
		prev.clear();
		earlier.clear();
		later.clear();

		assert(!x[root].isFixed() || x[root].getVal() != root);
		for (int i = 0; i < size; i++) {
			index[i] = -1;  // unvisited
		}

		index[root] = 0;  // first node visited
		lowlink[root] = 0;

		nodesSeen = 1;  // only seen root node
		propQueue.clear();

		// original subtree is just the root node
		int startSubtree = 0;
		int endSubtree = 0;

		// explore children of the root node
		for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i) {
			const int child = *i;

			if (index[child] == -1)  // if haven't explored this yet
			{
				numback = 0;
				if (!exploreSubtree(child, startSubtree, endSubtree, &backfrom, &backto, &numback)) {
					// fprintf(stderr, "failed in subtree\n");
					return false;  // fail if we found a scc within the child
				}

				// Find the nodes in the subtree we just explored and the ones still to be explored
				thisSubtree.clear();
				later.clear();
				for (int i = 0; i < size; i++) {
					if (index[i] < 0) {
						later.push(i);
					} else if (index[i] > endSubtree) {
						thisSubtree.push(i);
					}
				}

				const Lit evidenceThis = getEvidenceLit(thisSubtree);
				Lit evidenceOther = getEvidenceLit(prev);
				vec<int> alloutside;
				if (prev.size() == 0) {
					for (unsigned int i = 0; i < later.size(); i++) {
						alloutside.push(later[i]);
					}
					alloutside.push(root);
					evidenceOther = getEvidenceLit(alloutside);
				}

				if (evidenceThis != lit_True && evidenceOther != lit_True) {
					// If there's no edge from the new subtree back to the
					// previous one and both of these groups has
					// a variable definitely in, fail
					if (numback == 0) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.nobackedge++;
						if (so.lazy) {
							// If prev is empty then this is the first subtree,
							// and we just need to say that
							// the nodes in this subtree can't reach the
							// unexplored nodes or the root.
							// This is only a problem if something outside this subtree has to be in.
							if (prev.size() == 0) {
								Clause* r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside
								explainAcantreachB(r, 3, thisSubtree, alloutside, thisSubtree[0], alloutside[0]);
								x[thisSubtree[0]].setVal(alloutside[0], r);

								return false;
							}

							// Assuming we have at least one previous subtree,
							// the reason we're failing is that
							// 1. nodes in earlier subtrees can't reach the
							// previous one this one or unexplored ones,
							// 2. nodes in the previous subtree can't reach
							// this one or unexplored ones,
							// 3. and nodes in this subtree can't reach the
							// previous one or unexplored ones.
							vec<int> prev_later;
							for (unsigned int i = 0; i < prev.size(); i++) {
								prev_later.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prev_later.push(later[i]);
							}
							vec<int> prev_this_later;
							for (unsigned int i = 0; i < prev_later.size(); i++) {
								prev_this_later.push(prev_later[i]);
							}
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								prev_this_later.push(thisSubtree[i]);
							}
							vec<int> this_later;
							for (unsigned int i = 0; i < thisSubtree.size(); i++) {
								this_later.push(thisSubtree[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								this_later.push(later[i]);
							}

							const int size1 = earlier.size() * prev_this_later.size();
							const int size2 = prev.size() * this_later.size();
							const int size3 = thisSubtree.size() * prev_later.size();
							assert(prev_later.size() > 0);
							Clause* r = Reason_new(size1 + size2 + size3 + 2);
							(*r)[1] = evidenceThis;
							(*r)[2] = evidenceOther;
							// 1. Earlier can't reach prev, this or later
							explainAcantreachB(r, 3, earlier, prev_this_later);

							// 2. Prev can't reach this or later
							explainAcantreachB(r, 3 + size1, prev, this_later);

							// 3. this can't reach prev or later
							explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, thisSubtree[0],
																 prev_later[0]);
							x[thisSubtree[0]].setVal(prev_later[0], r);
						}
						return false;
					}

					// If there's only one, the back edge is required (only propagate if the option is set)
					if (fixReq && numback == 1) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.fixedBackedge++;
						Clause* r = nullptr;
						if (so.lazy) {
							// If this is the first subtree, the reason we're setting this link is that
							// there is no other link between nodes of this subtree to nodes outside the subtree
							// including the root
							if (prev.size() == 0) {
								r = Reason_new(thisSubtree.size() * alloutside.size() + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;
								// This subtree can't reach outside (except backfrom to backto)
								explainAcantreachB(r, 3, thisSubtree, alloutside, backfrom, backto);
							} else {
								// Otherwise we have at least one previous subtree.
								// The reason is the same as when failing above,
								// but we leave out the one we're setting
								vec<int> prev_later;
								for (unsigned int i = 0; i < prev.size(); i++) {
									prev_later.push(prev[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									prev_later.push(later[i]);
								}
								vec<int> prev_this_later;
								for (unsigned int i = 0; i < prev_later.size(); i++) {
									prev_this_later.push(prev_later[i]);
								}
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									prev_this_later.push(thisSubtree[i]);
								}
								vec<int> this_later;
								for (unsigned int i = 0; i < thisSubtree.size(); i++) {
									this_later.push(thisSubtree[i]);
								}
								for (unsigned int i = 0; i < later.size(); i++) {
									this_later.push(later[i]);
								}

								const int size1 = earlier.size() * prev_this_later.size();
								const int size2 = prev.size() * this_later.size();
								const int size3 = thisSubtree.size() * prev_later.size();
								r = Reason_new(size1 + size2 + size3 + 2);
								(*r)[1] = evidenceThis;
								(*r)[2] = evidenceOther;

								// 1. Earlier can't reach prev, this or later
								explainAcantreachB(r, 3, earlier, prev_this_later);

								// 2. Prev can't reach this or later
								explainAcantreachB(r, 3 + size1, prev, this_later);

								// 3. this can't reach prev or unexplored (except for the one we're setting)
								explainAcantreachB(r, 3 + size1 + size2, thisSubtree, prev_later, backfrom, backto);
							}
						}

						addPropagation(true, backfrom, backto, r);
					}
				}

				// When a new subtree has been explored, update the prev and earlier vectors (only necessary
				// if explaining)
				for (unsigned int i = 0; i < prev.size(); i++) {
					earlier.push(prev[i]);
				}
				prev.clear();
				for (unsigned int i = 0; i < thisSubtree.size(); i++) {
					prev.push(thisSubtree[i]);
				}

				// Set the new subtree boundaries
				startSubtree = endSubtree + 1;
				endSubtree = nodesSeen - 1;
			}
		}

		// If we haven't reached all of the nodes and something we have reached has to
		// be included, then set everything outside to take its own index
		if (nodesSeen != size) {
			vec<int> seen;
			vec<int> notseen;

			for (int var = 0; var < size; var++) {
				if (index[var] >= 0) {
					seen.push(var);
				} else {
					notseen.push(var);
				}
			}
			const int numNotSeen = size - nodesSeen;
			assert(static_cast<int>(seen.size()) == nodesSeen);
			assert(static_cast<int>(notseen.size()) == numNotSeen);

			const Lit evidenceSeen = getEvidenceLit(seen);
			if (evidenceSeen != lit_True) {
				// XXX [AS] Commented following line, because propagator related statistics
				// should be collected within the propagator class.
				// engine.disconnected++;
				Clause* r = nullptr;

				if (so.lazy) {
					// need to say that each seen node doesn't reach any non-seen node
					r = Reason_new(nodesSeen * numNotSeen + 2);
					(*r)[1] = evidenceSeen;
					explainAcantreachB(r, 2, seen, notseen);
				}
				for (unsigned int i = 0; i < notseen.size(); i++) {
					const int outsideVar = notseen[i];
					if (x[outsideVar].setValNotR(outsideVar)) {
						if (!x[outsideVar].setVal(outsideVar, r)) {
							return false;
						}
					}
				}
			}
		}

		// If we're pruning root edges and there was more than one subtree, prune edges from the root to
		// earlier subtrees
		if (pruneRoot && startSubtree > 1) {
			// Check there's evidence
			// First find the nodes in the last subtree (and disconnected nodes) and those in the earlier
			// ones

			vec<int> lastSubtreeAndOutside;
			vec<int> earlierSubtree;
			for (int i = 0; i < size; i++) {
				if (index[i] >= startSubtree || index[i] < 0) {
					lastSubtreeAndOutside.push(i);
				} else if (index[i] > 0) {  // The root is considered in no subtree
					earlierSubtree.push(i);
				} else {
					assert(i == root);
				}
			}
			assert(earlierSubtree.size() > 0);
			assert(earlierSubtree.size() + lastSubtreeAndOutside.size() + 1 ==
						 static_cast<unsigned int>(size));
			const Lit evidenceLast = getEvidenceLit(lastSubtreeAndOutside);
			if (evidenceLast != lit_True) {
				// Build the reason if necessary (it will be the same for all of the pruned edges)
				Clause* r = nullptr;
				if (so.lazy) {
					// Reason should state that no var in an earlier sub tree reaches a var
					// in the last subtree or outside
					r = Reason_new(earlierSubtree.size() * lastSubtreeAndOutside.size() + 2);
					(*r)[1] = evidenceLast;
					explainAcantreachB(r, 2, earlierSubtree, lastSubtreeAndOutside);
				}

				// Prune all edges from the root to nodes in earlier subtrees
				for (int i = 0; i < size; i++) {
					if (i != root && index[i] < startSubtree) {
						addPropagation(false, root, i, r);
					}
				}

				/* for (typename IntView<U>::iterator i = x[root].begin(); i != x[root].end(); ++i)
				 {
						 if(*i != root && index[*i] < startSubtree)
						 {
								 // XXX [AS] Commented following line, because propagator related statistics
								 // should be collected within the propagator class.
								 //engine.prunedRoot++;
								 addPropagation(false, root, *i, r);
						 }
				 }*/
			}
		}

		// Perform the propagations
		for (unsigned int i = 0; i < propQueue.size(); i++) {
			PROP const p = propQueue[i];
			// fprintf(stderr, "propagating\n");
			if (p.fix) {
				if (x[p.var].setValNotR(p.val)) {
					if (!x[p.var].setVal(p.val, p.reason)) {
						return false;
					}
				}
			} else {
				if (x[p.var].remValNotR(p.val)) {
					if (!x[p.var].remVal(p.val, p.reason)) {
						return false;
					}
				}
			}
		}
		return true;
	}